

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_HILO1_tx79(DisasContext_conflict6 *ctx,uint32_t opc,int reg)

{
  TCGContext_conflict6 *tcg_ctx_00;
  TCGContext_conflict6 *tcg_ctx;
  int reg_local;
  uint32_t opc_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((reg != 0) || ((opc != 0x70000010 && (opc != 0x70000012)))) {
    switch(opc) {
    case 0x70000010:
      tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[reg],tcg_ctx_00->cpu_HI[1]);
      break;
    case 0x70000011:
      if (reg == 0) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_HI[1],0);
      }
      else {
        tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_HI[1],tcg_ctx_00->cpu_gpr[reg]);
      }
      break;
    case 0x70000012:
      tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_gpr[reg],tcg_ctx_00->cpu_LO[1]);
      break;
    case 0x70000013:
      if (reg == 0) {
        tcg_gen_movi_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_LO[1],0);
      }
      else {
        tcg_gen_mov_i64_mips64el(tcg_ctx_00,tcg_ctx_00->cpu_LO[1],tcg_ctx_00->cpu_gpr[reg]);
      }
      break;
    default:
      generate_exception_end(ctx,0x14);
    }
  }
  return;
}

Assistant:

static void gen_HILO1_tx79(DisasContext *ctx, uint32_t opc, int reg)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (reg == 0 && (opc == MMI_OPC_MFHI1 || opc == MMI_OPC_MFLO1)) {
        /* Treat as NOP. */
        return;
    }

    switch (opc) {
    case MMI_OPC_MFHI1:
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg], tcg_ctx->cpu_HI[1]);
        break;
    case MMI_OPC_MFLO1:
        tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[reg], tcg_ctx->cpu_LO[1]);
        break;
    case MMI_OPC_MTHI1:
        if (reg != 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_HI[1], tcg_ctx->cpu_gpr[reg]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_HI[1], 0);
        }
        break;
    case MMI_OPC_MTLO1:
        if (reg != 0) {
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_LO[1], tcg_ctx->cpu_gpr[reg]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_LO[1], 0);
        }
        break;
    default:
        MIPS_INVAL("mfthilo1 TX79");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
}